

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O2

bool __thiscall Tank::createServer(Tank *this)

{
  string *this_00;
  __fd_mask *p_Var1;
  addrinfo *paVar2;
  uint __i;
  int iVar3;
  long lVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  string sStack_38;
  
  std::__cxx11::to_string(&sStack_38,this->vector_order + 10000);
  this_00 = &this->myPort;
  std::__cxx11::string::operator=((string *)this_00,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->myhints).ai_socktype = 0;
  (this->myhints).ai_protocol = 0;
  *(undefined8 *)&(this->myhints).ai_addrlen = 0;
  (this->myhints).ai_addr = (sockaddr *)0x0;
  (this->myhints).ai_canonname = (char *)0x0;
  (this->myhints).ai_next = (addrinfo *)0x0;
  (this->myhints).ai_socktype = 1;
  (this->myhints).ai_flags = 1;
  (this->myhints).ai_family = 2;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    (this->master).fds_bits[lVar4] = 0;
  }
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    (this->tmpSet).fds_bits[lVar4] = 0;
  }
  iVar3 = getaddrinfo((char *)0x0,(this->myPort)._M_dataplus._M_p,(addrinfo *)&this->myhints,
                      (addrinfo **)&this->myaddr);
  if (iVar3 == 0) {
    paVar2 = this->myaddr;
    iVar3 = socket(paVar2->ai_family,paVar2->ai_socktype,paVar2->ai_protocol);
    this->listener = iVar3;
    if (iVar3 == -1) {
      printf("Cannot create new socket%s\n",(this_00->_M_dataplus)._M_p);
      return false;
    }
    this->fdMax = iVar3;
    p_Var1 = (this->master).fds_bits + iVar3 / 0x40;
    *p_Var1 = *p_Var1 | 1L << ((byte)iVar3 & 0x3f);
    iVar3 = bind(iVar3,(sockaddr *)this->myaddr->ai_addr,this->myaddr->ai_addrlen);
    if (iVar3 == 0) {
      iVar3 = listen(this->listener,0xf);
      if (iVar3 != 0) {
        printf("Cannot listen on socket");
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        if (iVar3 == 9) {
          pcVar7 = "bad descriptor";
        }
        else if (iVar3 == 0x58) {
          pcVar7 = "not a socket";
        }
        else if (iVar3 == 0x5f) {
          pcVar7 = "not a supported type";
        }
        else {
          if (iVar3 != 0x62) goto LAB_00106ac7;
          pcVar7 = "Address is in use";
        }
        poVar6 = std::operator<<((ostream *)&std::cerr,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        return false;
      }
LAB_00106ac7:
      freeaddrinfo((addrinfo *)this->myaddr);
      poVar6 = std::operator<<((ostream *)&std::cout,"TANK: ");
      pcVar7 = "GREEN_";
      if (this->color == RED) {
        pcVar7 = "RED_";
      }
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->vector_order);
      poVar6 = std::operator<<(poVar6," Spawned and listening on ");
      poVar6 = std::operator<<(poVar6,(string *)this_00);
      std::endl<char,std::char_traits<char>>(poVar6);
      this->fdMax = this->listener;
      return true;
    }
    pcVar7 = "Cannot bind socket to address";
  }
  else {
    pcVar7 = "Cannot get server IP address";
  }
  puts(pcVar7);
  return false;
}

Assistant:

bool Tank::createServer()
{

        int myPortInt = 10000;
        myPortInt += this->vector_order; // + order in vector of tanks in world
        myPort = std::to_string(myPortInt);

        memset(&myhints, 0, sizeof(struct addrinfo));
        myhints.ai_socktype = SOCK_STREAM;
        myhints.ai_family = AF_INET;
        myhints.ai_flags = AI_PASSIVE;

        FD_ZERO(&master);
        FD_ZERO (&tmpSet);

        if (getaddrinfo(NULL, myPort.c_str(), &myhints, &myaddr) != 0) {
            printf("Cannot get server IP address\n");
            return false;
        }

        // Create listener socket
        listener = socket(myaddr->ai_family, myaddr->ai_socktype, myaddr->ai_protocol);
        if (listener == -1) {
            printf("Cannot create new socket%s\n", myPort.c_str());
            return false;
        }

        fdMax = listener;
        FD_SET(listener, &master);

        if (bind(listener, myaddr->ai_addr, myaddr->ai_addrlen) != 0) {
                printf("Cannot bind socket to address\n");
                return false;
            }


        if (listen(listener, 15) != 0) {
           printf("Cannot listen on socket");
	   switch(errno){
        	case EADDRINUSE:
            		std::cerr << "Address is in use" << std::endl;
            		return false;
       	 	case EBADF:
            		std::cerr << "bad descriptor" << std::endl;
            		return false;
        	case ENOTSOCK:
            		std::cerr << "not a socket" << std::endl;
            		return false;
        	case EOPNOTSUPP:
            		std::cerr << "not a supported type" << std::endl;
		        return false;
        	}
        }

        freeaddrinfo(myaddr);
        std::cout << "TANK: " << (this->color == RED ? "RED_" : "GREEN_") << vector_order << " Spawned and listening on " << myPort << std::endl;
        fdMax = listener;
        return true;
}